

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

FBaseCVar * GetCVar(AActor *activator,char *cvarname)

{
  uint32 uVar1;
  FBaseCVar *cvar;
  char *cvarname_local;
  AActor *activator_local;
  
  activator_local = (AActor *)FindCVar(cvarname,(FBaseCVar **)0x0);
  if ((activator_local == (AActor *)0x0) ||
     (uVar1 = FBaseCVar::GetFlags((FBaseCVar *)activator_local), (uVar1 & 0x4000) != 0)) {
    activator_local = (AActor *)0x0;
  }
  else {
    uVar1 = FBaseCVar::GetFlags((FBaseCVar *)activator_local);
    if ((uVar1 & 2) != 0) {
      if ((activator == (AActor *)0x0) || (activator->player == (player_t *)0x0)) {
        activator_local = (AActor *)0x0;
      }
      else {
        activator_local =
             (AActor *)
             GetUserCVar((int)((long)(activator->player[-0xa3fb].weapons.Slots + 4) / 0x2a0),
                         cvarname);
      }
    }
  }
  return (FBaseCVar *)activator_local;
}

Assistant:

FBaseCVar *GetCVar(AActor *activator, const char *cvarname)
{
	FBaseCVar *cvar = FindCVar(cvarname, nullptr);
	// Either the cvar doesn't exist, or it's for a mod that isn't loaded, so return nullptr.
	if (cvar == nullptr || (cvar->GetFlags() & CVAR_IGNORE))
	{
		return nullptr;
	}
	else
	{
		// For userinfo cvars, redirect to GetUserCVar
		if (cvar->GetFlags() & CVAR_USERINFO)
		{
			if (activator == nullptr || activator->player == nullptr)
			{
				return nullptr;
			}
			return GetUserCVar(int(activator->player - players), cvarname);
		}
		return cvar;
	}
}